

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

cmServerResponse * __thiscall
cmServerProtocol1::ProcessGlobalSettings
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *this_00;
  Value *pVVar1;
  Value obj;
  Value VStack_228;
  Value local_200;
  Value local_1d8;
  Value local_1b0;
  Value local_188;
  Value local_160;
  Value local_138;
  Value local_110;
  Value local_e8;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_48;
  
  this_00 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
            super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
            super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
            super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  Json::Value::Value(&VStack_228,objectValue);
  cmake::ReportCapabilitiesJson(&local_48,this_00,true);
  pVVar1 = Json::Value::operator[](&VStack_228,&kCAPABILITIES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_70,this_00->DebugOutput);
  pVVar1 = Json::Value::operator[](&VStack_228,&kDEBUG_OUTPUT_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_70);
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_98,this_00->Trace);
  pVVar1 = Json::Value::operator[](&VStack_228,&kTRACE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_98);
  Json::Value::~Value(&local_98);
  Json::Value::Value(&local_c0,this_00->TraceExpand);
  pVVar1 = Json::Value::operator[](&VStack_228,&kTRACE_EXPAND_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_c0);
  Json::Value::~Value(&local_c0);
  Json::Value::Value(&local_e8,this_00->WarnUninitialized);
  pVVar1 = Json::Value::operator[](&VStack_228,&kWARN_UNINITIALIZED_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_e8);
  Json::Value::~Value(&local_e8);
  Json::Value::Value(&local_110,this_00->WarnUnused);
  pVVar1 = Json::Value::operator[](&VStack_228,&kWARN_UNUSED_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_110);
  Json::Value::~Value(&local_110);
  Json::Value::Value(&local_138,this_00->WarnUnusedCli);
  pVVar1 = Json::Value::operator[](&VStack_228,&kWARN_UNUSED_CLI_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_138);
  Json::Value::~Value(&local_138);
  Json::Value::Value(&local_160,this_00->CheckSystemVars);
  pVVar1 = Json::Value::operator[](&VStack_228,&kCHECK_SYSTEM_VARS_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_160);
  Json::Value::~Value(&local_160);
  Json::Value::Value(&local_188,&(this->GeneratorInfo).SourceDirectory);
  pVVar1 = Json::Value::operator[](&VStack_228,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_188);
  Json::Value::~Value(&local_188);
  Json::Value::Value(&local_1b0,&(this->GeneratorInfo).BuildDirectory);
  pVVar1 = Json::Value::operator[](&VStack_228,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_1b0);
  Json::Value::~Value(&local_1b0);
  Json::Value::Value(&local_1d8,&(this->GeneratorInfo).GeneratorName);
  pVVar1 = Json::Value::operator[](&VStack_228,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_1d8);
  Json::Value::~Value(&local_1d8);
  Json::Value::Value(&local_200,&(this->GeneratorInfo).ExtraGeneratorName);
  pVVar1 = Json::Value::operator[](&VStack_228,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_200);
  Json::Value::~Value(&local_200);
  cmServerRequest::Reply(__return_storage_ptr__,request,&VStack_228);
  Json::Value::~Value(&VStack_228);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessGlobalSettings(
  const cmServerRequest& request)
{
  cmake* cm = this->CMakeInstance();
  Json::Value obj = Json::objectValue;

  // Capabilities information:
  obj[kCAPABILITIES_KEY] = cm->ReportCapabilitiesJson(true);

  obj[kDEBUG_OUTPUT_KEY] = cm->GetDebugOutput();
  obj[kTRACE_KEY] = cm->GetTrace();
  obj[kTRACE_EXPAND_KEY] = cm->GetTraceExpand();
  obj[kWARN_UNINITIALIZED_KEY] = cm->GetWarnUninitialized();
  obj[kWARN_UNUSED_KEY] = cm->GetWarnUnused();
  obj[kWARN_UNUSED_CLI_KEY] = cm->GetWarnUnusedCli();
  obj[kCHECK_SYSTEM_VARS_KEY] = cm->GetCheckSystemVars();

  obj[kSOURCE_DIRECTORY_KEY] = this->GeneratorInfo.SourceDirectory;
  obj[kBUILD_DIRECTORY_KEY] = this->GeneratorInfo.BuildDirectory;

  // Currently used generator:
  obj[kGENERATOR_KEY] = this->GeneratorInfo.GeneratorName;
  obj[kEXTRA_GENERATOR_KEY] = this->GeneratorInfo.ExtraGeneratorName;

  return request.Reply(obj);
}